

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Cast * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::doCast<wasm::RefCast>
          (Cast *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,RefCast *curr)

{
  bool bVar1;
  byte bVar2;
  ExpressionRunner<wasm::ModuleRunner> *this_00;
  Literal *pLVar3;
  Type *pTVar4;
  Literal local_1a0;
  Failure local_188;
  Literal local_170;
  Success local_158;
  uintptr_t local_140;
  uintptr_t local_130;
  Type castType;
  Literal val;
  Flow local_108;
  Breaking local_c0;
  undefined1 local_68 [8];
  Flow ref;
  RefCast *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  ref.breakTo.super_IString.str._M_str = (char *)curr;
  this_00 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  visit((Flow *)local_68,this_00,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x10));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(&local_108,(Flow *)local_68);
    Cast::Breaking::Breaking(&local_c0,&local_108);
    Cast::Cast<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking>
              (__return_storage_ptr__,&local_c0);
    Cast::Breaking::~Breaking(&local_c0);
    Flow::~Flow(&local_108);
  }
  else {
    pLVar3 = Flow::getSingleValue((Flow *)local_68);
    ::wasm::Literal::Literal((Literal *)&castType,pLVar3);
    pTVar4 = RefCast::getCastType((RefCast *)ref.breakTo.super_IString.str._M_str);
    local_140 = pTVar4->id;
    local_130 = local_140;
    bVar2 = ::wasm::Type::isSubType
                      ((Type)val.field_0.gcData.
                             super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi,(Type)local_140);
    if ((bVar2 & 1) == 0) {
      ::wasm::Literal::Literal(&local_1a0,(Literal *)&castType);
      Cast::Failure::Failure(&local_188,&local_1a0);
      Cast::Cast<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                (__return_storage_ptr__,&local_188);
      Cast::Failure::~Failure(&local_188);
      ::wasm::Literal::~Literal(&local_1a0);
    }
    else {
      ::wasm::Literal::Literal(&local_170,(Literal *)&castType);
      Cast::Success::Success(&local_158,&local_170);
      Cast::Cast<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success>
                (__return_storage_ptr__,&local_158);
      Cast::Success::~Success(&local_158);
      ::wasm::Literal::~Literal(&local_170);
    }
    ::wasm::Literal::~Literal((Literal *)&castType);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Cast doCast(T* curr) {
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return typename Cast::Breaking{ref};
    }
    Literal val = ref.getSingleValue();
    Type castType = curr->getCastType();
    if (Type::isSubType(val.type, castType)) {
      return typename Cast::Success{val};
    } else {
      return typename Cast::Failure{val};
    }
  }